

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.c
# Opt level: O3

void base64_stream_encode_neon64
               (base64_state *state,char *src,size_t srclen,char *out,size_t *outlen)

{
  *outlen = 0;
  return;
}

Assistant:

BASE64_ENC_FUNCTION(neon64)
{
#ifdef BASE64_USE_NEON64
	#include "../generic/enc_head.c"
	enc_loop_neon64(&s, &slen, &o, &olen);
	enc_loop_generic_64(&s, &slen, &o, &olen);
	#include "../generic/enc_tail.c"
#else
	BASE64_ENC_STUB
#endif
}